

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O2

void ClearRectangle(WebPPicture *picture,int left,int top,int width,int height)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = height + top;
  for (; top < iVar3; top = top + 1) {
    iVar1 = picture->argb_stride;
    puVar2 = picture->argb;
    for (lVar4 = (long)left; lVar4 < width + left; lVar4 = lVar4 + 1) {
      puVar2[iVar1 * top + lVar4] = 0;
    }
  }
  return;
}

Assistant:

static void ClearRectangle(WebPPicture* const picture,
                           int left, int top, int width, int height) {
  int j;
  for (j = top; j < top + height; ++j) {
    uint32_t* const dst = picture->argb + j * picture->argb_stride;
    int i;
    for (i = left; i < left + width; ++i) {
      dst[i] = TRANSPARENT_COLOR;
    }
  }
}